

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O3

Expression * __thiscall
wasm::anon_unknown_0::AsyncifyBuilder::makeGetStackPos(AsyncifyBuilder *this)

{
  uintptr_t uVar1;
  uintptr_t uVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  undefined4 *puVar8;
  Expression *pEVar9;
  
  uVar6 = wasm::Type::getByteSize(&this->pointerType);
  uVar7 = wasm::Type::getByteSize(&this->pointerType);
  uVar5 = DAT_00da77f0;
  uVar4 = wasm::(anonymous_namespace)::ASYNCIFY_DATA;
  uVar1 = (this->pointerType).id;
  puVar8 = (undefined4 *)MixedArena::allocSpace(&((this->super_Builder).wasm)->allocator,0x20,8);
  *puVar8 = 10;
  *(undefined8 *)(puVar8 + 4) = uVar4;
  *(undefined8 *)(puVar8 + 6) = uVar5;
  *(uintptr_t *)(puVar8 + 2) = uVar1;
  uVar1 = (this->pointerType).id;
  uVar2 = (this->asyncifyMemory).super_IString.str._M_len;
  pcVar3 = (this->asyncifyMemory).super_IString.str._M_str;
  pEVar9 = (Expression *)MixedArena::allocSpace(&((this->super_Builder).wasm)->allocator,0x48,8);
  pEVar9->_id = LoadId;
  *(undefined1 *)&pEVar9[2].type.id = 0;
  *(char *)&pEVar9[1]._id = (char)uVar6;
  *(byte *)((long)&pEVar9[1]._id + 1) = 0;
  pEVar9[1].type.id = 0;
  *(ulong *)(pEVar9 + 2) = (ulong)uVar7;
  *(undefined4 **)(pEVar9 + 3) = puVar8;
  (pEVar9->type).id = uVar1;
  pEVar9[3].type.id = uVar2;
  *(char **)(pEVar9 + 4) = pcVar3;
  return pEVar9;
}

Assistant:

Expression* makeGetStackPos() {
    return makeLoad(pointerType.getByteSize(),
                    false,
                    int(DataOffset::BStackPos),
                    pointerType.getByteSize(),
                    makeGlobalGet(ASYNCIFY_DATA, pointerType),
                    pointerType,
                    asyncifyMemory);
  }